

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowManager.cpp
# Opt level: O1

bool __thiscall gui::CWindowManager::Draw(CWindowManager *this,IFrameBuffer *fb,TRect *dirtyRect)

{
  TPoint TVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  TPoint TVar5;
  bool bVar6;
  bool in_R9B;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  TRect client;
  TRect TVar7;
  TRect rect;
  TRect local_40;
  
  TVar1 = (TPoint)(this->m_desktop).super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
  TVar7.p1 = TVar1;
  TVar7.p0 = *(TPoint *)((long)TVar1 + 0x720);
  bVar6 = DrawWindow((gui *)fb,(IFrameBuffer *)((TRect *)((long)TVar1 + 0x718))->p0,TVar7,
                     (CWindow *)0x0,in_R9B);
  if ((bVar6) || (this->m_mouseDirty == true)) {
    peVar2 = (this->m_cursor).super___shared_ptr<gui::CCursor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar3 = (peVar2->m_images).
             super__Vector_base<std::shared_ptr<gui::CImageData>,_std::allocator<std::shared_ptr<gui::CImageData>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((peVar2->m_images).
        super__Vector_base<std::shared_ptr<gui::CImageData>,_std::allocator<std::shared_ptr<gui::CImageData>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == psVar3) {
      this_00 = (CImageData *)0x0;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (psVar3->super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (psVar3->super___shared_ptr<gui::CImageData,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
    }
    if (this_00 != (CImageData *)0x0) {
      client.p1 = (TPoint)(this->m_desktop).
                          super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      client.p0 = (this->m_oldMouseRect).p1;
      DrawWindow((gui *)fb,(IFrameBuffer *)(this->m_oldMouseRect).p0,client,(CWindow *)0x1,in_R9B);
      local_40.p0.x = (this->m_mousePosition).x - this_00->m_xh;
      local_40.p0.y = (this->m_mousePosition).y - this_00->m_yh;
      local_40.p1.x = this_00->m_width + local_40.p0.x;
      local_40.p1.y = this_00->m_height + local_40.p0.y;
      CImageData::Draw(this_00,fb,local_40.p0.x,local_40.p0.y);
      TVar7 = TRect::Union(&this->m_oldMouseRect,&local_40);
      *dirtyRect = TVar7;
      this->m_mouseDirty = false;
      TVar1.y = local_40.p0.y;
      TVar1.x = local_40.p0.x;
      TVar5.y = local_40.p1.y;
      TVar5.x = local_40.p1.x;
      (this->m_oldMouseRect).p0 = TVar1;
      (this->m_oldMouseRect).p1 = TVar5;
    }
    if (bVar6) {
      peVar4 = (this->m_desktop).super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      TVar1 = (peVar4->m_rect).p1;
      dirtyRect->p0 = (peVar4->m_rect).p0;
      dirtyRect->p1 = TVar1;
    }
    bVar6 = true;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool CWindowManager::Draw(IFrameBuffer &fb, TRect &dirtyRect) {
    auto dirty = DrawWindow(fb, m_desktop->GetRect(), *m_desktop.get(), false);
    if (!dirty && !m_mouseDirty) {
        return false;
    }

    // TODO: handle hotspot
    auto cursor = m_cursor->GetCursor();
    if (cursor) {
        // Clear the old pointer first
        DrawWindow(fb, m_oldMouseRect, *m_desktop.get(), true);

        // Draw the new pointer
        auto x = m_mousePosition.x - cursor->GetXHotspot();
        auto y = m_mousePosition.y - cursor->GetYHotspot();
        TRect rect(x, y, x + cursor->GetWidth(), y + cursor->GetHeight());

        cursor->Draw(fb, x, y);
        dirtyRect = TRect::Union(m_oldMouseRect, rect);
        m_mouseDirty = false;
        m_oldMouseRect = rect;
    }

    if (dirty) {
        dirtyRect = m_desktop->GetRect();
    }

    return true;
}